

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O1

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  
  iVar1 = Cast::forward((Cast *)((long)&this->_vptr_Cast_x86 + (long)this->_vptr_Cast_x86[-3]),
                        bottom_blob,top_blob,opt);
  return iVar1;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_AVX2
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * elempack;

    if (type_from == 1 && type_to == 2)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = { _mm256_setzero_si256() };
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m256 fp32 = _mm256_loadu_ps(ptr);
                __m128i fp16 = _mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC);
                _mm_store_si128((__m128i*)outptr, fp16);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                __m256 fp32 = _mm256_maskload_ps(ptr, mask.vec);
                m128i fp16 = { _mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC) };
                memcpy(outptr, fp16.m128i_u16, remain * sizeof(unsigned short));
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = { _mm256_setzero_si256() };
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m128i fp16 = _mm_lddqu_si128 ((__m128i const*)ptr);
                __m256 fp32 = _mm256_cvtph_ps(fp16);
                _mm256_storeu_ps(outptr, fp32);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                m128i fp16 = { _mm_setzero_si128() };
                memcpy(fp16.m128i_u16, ptr, remain * sizeof(unsigned short));
                __m256 fp32 = _mm256_cvtph_ps(fp16.vec);
                _mm256_maskstore_ps(outptr, mask.vec, fp32);
            }
        }
    }

    if (type_from == 4 || type_to == 4)
    {
        // TODO
        return Cast::forward(bottom_blob, top_blob, opt);
    }

    return 0;
#else //NCNN_AVX2

    return Cast::forward(bottom_blob, top_blob, opt);

#endif //NCNN_AVX2
}